

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadAuxiliary
          (ByteCodeBufferReader *this,byte *buffer,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  ByteBlock *local_70;
  ByteBlock *local_68;
  SerializedAuxiliary *part;
  uint i;
  ByteBlock *auxContextBlock;
  ByteBlock *auxBlock;
  uint local_30;
  uint32 sizeOfAuxiliaryContextBlock;
  uint32 sizeOfAuxiliaryBlock;
  uint32 countOfAuxiliaryStructure;
  byte *current;
  FunctionBody *functionBody_local;
  byte *buffer_local;
  ByteCodeBufferReader *this_local;
  
  _sizeOfAuxiliaryBlock = buffer;
  current = (byte *)functionBody;
  functionBody_local = (FunctionBody *)buffer;
  buffer_local = (byte *)this;
  _sizeOfAuxiliaryBlock = ReadUInt32(this,buffer,&sizeOfAuxiliaryContextBlock);
  if (sizeOfAuxiliaryContextBlock == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xb8b,"(countOfAuxiliaryStructure != 0)",
                                "countOfAuxiliaryStructure != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  _sizeOfAuxiliaryBlock = ReadUInt32(this,_sizeOfAuxiliaryBlock,&local_30);
  _sizeOfAuxiliaryBlock = ReadUInt32(this,_sizeOfAuxiliaryBlock,(uint *)((long)&auxBlock + 4));
  if (local_30 == 0) {
    local_68 = (ByteBlock *)0x0;
  }
  else {
    pRVar4 = ScriptContext::GetRecycler(this->scriptContext);
    local_68 = ByteBlock::New(pRVar4,(byte *)0x0,local_30);
  }
  if (auxBlock._4_4_ == 0) {
    local_70 = (ByteBlock *)0x0;
  }
  else {
    pRVar4 = ScriptContext::GetRecycler(this->scriptContext);
    local_70 = ByteBlock::New(pRVar4,(byte *)0x0,auxBlock._4_4_);
  }
  part._4_4_ = 0;
  do {
    if (sizeOfAuxiliaryContextBlock <= part._4_4_) {
      FunctionBody::SetAuxiliaryData((FunctionBody *)current,local_68);
      FunctionBody::SetAuxiliaryContextData((FunctionBody *)current,local_70);
      return _sizeOfAuxiliaryBlock;
    }
    switch(_sizeOfAuxiliaryBlock[4]) {
    case '\x01':
      _sizeOfAuxiliaryBlock =
           DeserializeVarArray<Js::AuxArray<void*>>
                     (this,this->scriptContext,_sizeOfAuxiliaryBlock,local_68);
      break;
    case '\x02':
      _sizeOfAuxiliaryBlock =
           DeserializeVarArray<Js::VarArrayVarCount>
                     (this,this->scriptContext,_sizeOfAuxiliaryBlock,local_70);
      break;
    case '\x03':
      _sizeOfAuxiliaryBlock =
           DeserializePropertyIdArray
                     (this,this->scriptContext,_sizeOfAuxiliaryBlock,local_68,
                      (FunctionBody *)current);
      break;
    case '\x04':
      _sizeOfAuxiliaryBlock =
           DeserializeFuncInfoArray(this,this->scriptContext,_sizeOfAuxiliaryBlock,local_68);
      break;
    case '\x05':
      _sizeOfAuxiliaryBlock =
           DeserializeIntArray(this,this->scriptContext,_sizeOfAuxiliaryBlock,local_68);
      break;
    case '\x06':
      _sizeOfAuxiliaryBlock =
           DeserializeFloatArray(this,this->scriptContext,_sizeOfAuxiliaryBlock,local_68);
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0xba1,"(false)","Unexpected auxiliary kind");
      if (bVar2) {
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    part._4_4_ = part._4_4_ + 1;
  } while( true );
}

Assistant:

const byte * ReadAuxiliary(const byte * buffer, FunctionBody * functionBody)
    {
        const byte * current = buffer;
        uint32 countOfAuxiliaryStructure;
        current = ReadUInt32(current, &countOfAuxiliaryStructure);
        Assert(countOfAuxiliaryStructure != 0);

        uint32 sizeOfAuxiliaryBlock;
        uint32 sizeOfAuxiliaryContextBlock;
        current = ReadUInt32(current, &sizeOfAuxiliaryBlock);
        current = ReadUInt32(current, &sizeOfAuxiliaryContextBlock);

        ByteBlock * auxBlock = sizeOfAuxiliaryBlock?
            ByteBlock::New(scriptContext->GetRecycler(), nullptr, sizeOfAuxiliaryBlock) : nullptr;
        ByteBlock * auxContextBlock = sizeOfAuxiliaryContextBlock?
            ByteBlock::New(scriptContext->GetRecycler(), nullptr, sizeOfAuxiliaryContextBlock) : nullptr;

        for (uint i = 0; i < countOfAuxiliaryStructure; i++)
        {
            typedef serialization_alignment const SerializedAuxiliary TBase;
            auto part = (serialization_alignment const SerializedAuxiliary * )current;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            Assert(part->auxMagic == magicStartOfAux);
#endif
            switch(part->kind)
            {
            default:
                AssertMsg(false, "Unexpected auxiliary kind");
                Throw::FatalInternalError();
                break;

            case sakVarArrayIntCount:
                current = DeserializeVarArray<VarArray>(scriptContext, current, auxBlock);
                break;

            case sakVarArrayVarCount:
                current = DeserializeVarArray<VarArrayVarCount>(scriptContext, current, auxContextBlock);
                break;

            case sakIntArray:
                current = DeserializeIntArray(scriptContext, current, auxBlock);
                break;

            case sakFloatArray:
                current = DeserializeFloatArray(scriptContext, current, auxBlock);
                break;

            case sakPropertyIdArray:
                current = DeserializePropertyIdArray(scriptContext, current, auxBlock, functionBody);
                break;

            case sakFuncInfoArray:
                current = DeserializeFuncInfoArray(scriptContext, current, auxBlock);
                break;
            }
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            int magicEnd;
            current = ReadInt32(current, &magicEnd);
            Assert(magicEnd == magicEndOfAux);
#endif
        }
        functionBody->SetAuxiliaryData(auxBlock);
        functionBody->SetAuxiliaryContextData(auxContextBlock);

        return current;
    }